

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  byte bVar2;
  int iVar3;
  stbi_uc asVar4 [4];
  int in_ECX;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  stbi__context *in_RDX;
  stbi_uc (*in_RSI) [4];
  stbi__context *in_RDI;
  stbi_uc version;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  
  sVar1 = stbi__get8((stbi__context *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  if ((((sVar1 != 'G') ||
       (sVar1 = stbi__get8((stbi__context *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8)),
       sVar1 != 'I')) ||
      (sVar1 = stbi__get8((stbi__context *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8)), sVar1 != 'F'
      )) || (sVar1 = stbi__get8((stbi__context *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8)),
            sVar1 != '8')) {
    iVar3 = stbi__err("not GIF");
    return iVar3;
  }
  sVar1 = stbi__get8((stbi__context *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  uVar7 = CONCAT13(sVar1,(int3)in_stack_ffffffffffffffd8);
  if ((sVar1 != '7') && (sVar1 != '9')) {
    iVar3 = stbi__err("not GIF");
    return iVar3;
  }
  sVar1 = stbi__get8((stbi__context *)CONCAT44(in_ECX,uVar7));
  if (sVar1 != 'a') {
    iVar3 = stbi__err("not GIF");
    return iVar3;
  }
  stbi__g_failure_reason = "";
  asVar4 = (stbi_uc  [4])stbi__get16le(in_RDX);
  *in_RSI = asVar4;
  asVar4 = (stbi_uc  [4])stbi__get16le(in_RDX);
  in_RSI[1] = asVar4;
  bVar2 = stbi__get8((stbi__context *)CONCAT44(in_ECX,uVar7));
  asVar4[1] = '\0';
  asVar4[2] = '\0';
  asVar4[3] = '\0';
  asVar4[0] = bVar2;
  in_RSI[8] = asVar4;
  bVar2 = stbi__get8((stbi__context *)CONCAT44(in_ECX,uVar7));
  asVar5[1] = '\0';
  asVar5[2] = '\0';
  asVar5[3] = '\0';
  asVar5[0] = bVar2;
  in_RSI[9] = asVar5;
  bVar2 = stbi__get8((stbi__context *)CONCAT44(in_ECX,uVar7));
  asVar6[1] = '\0';
  asVar6[2] = '\0';
  asVar6[3] = '\0';
  asVar6[0] = bVar2;
  in_RSI[10] = asVar6;
  in_RSI[0xb] = (stbi_uc  [4])0xffffffff;
  if (in_RDX != (stbi__context *)0x0) {
    in_RDX->img_x = 4;
  }
  if (in_ECX != 0) {
    return 1;
  }
  if (((uint)in_RSI[8] & 0x80) != 0) {
    stbi__gif_parse_colortable(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  }
  return 1;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}